

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall
ON_SubD::DeleteMarkedComponents
          (ON_SubD *this,bool bDeleteMarkedComponents,ON__UINT8 mark_bits,bool bMarkDeletedFaceEdges
          )

{
  bool bVar1;
  ON_SimpleArray<ON_SubDComponentPtr> cptr_list;
  ON_SimpleArray<ON_SubDComponentPtr> local_28;
  
  local_28._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00819a00;
  local_28.m_a = (ON_SubDComponentPtr *)0x0;
  local_28.m_count = 0;
  local_28.m_capacity = 0;
  GetMarkedComponents(this,bDeleteMarkedComponents,mark_bits,true,true,true,&local_28);
  bVar1 = DeleteComponentsForExperts
                    (this,local_28.m_a,local_28._16_8_ & 0xffffffff,true,true,bMarkDeletedFaceEdges)
  ;
  ON_SimpleArray<ON_SubDComponentPtr>::~ON_SimpleArray(&local_28);
  return bVar1;
}

Assistant:

bool ON_SubD::DeleteMarkedComponents(
  bool bDeleteMarkedComponents,
  ON__UINT8 mark_bits,
  bool bMarkDeletedFaceEdges
)
{
  ON_SimpleArray<ON_SubDComponentPtr> cptr_list;
  GetMarkedComponents(bDeleteMarkedComponents, mark_bits, true, true, true, cptr_list);
  return DeleteComponents(
    cptr_list.Array(),
    cptr_list.UnsignedCount(),
    bMarkDeletedFaceEdges
  );
}